

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O3

size_t FSE_compress_wksp(void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,
                        uint tableLog,void *workSpace,size_t wkspSize)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  S16 norm [256];
  uint count [256];
  uint local_654;
  void *local_650;
  ulong local_648;
  void *local_640;
  short local_638 [256];
  uint local_438 [258];
  
  iVar2 = 1 << ((char)tableLog - 1U & 0x1f);
  iVar5 = 0x400;
  if (0xc < tableLog) {
    iVar5 = 1 << ((char)tableLog - 2U & 0x1f);
  }
  if (wkspSize < iVar5 + iVar2 + maxSymbolValue * 2 + 3) {
    return 0xffffffffffffffd4;
  }
  if (1 < srcSize) {
    uVar9 = (ulong)(iVar2 + maxSymbolValue * 2 + 3);
    pvVar1 = (void *)((long)workSpace + uVar9 * 4);
    sVar8 = wkspSize + uVar9 * -4;
    local_654 = maxSymbolValue;
    if (maxSymbolValue == 0) {
      local_654 = 0xff;
    }
    uVar10 = 0xb;
    if (tableLog != 0) {
      uVar10 = tableLog;
    }
    local_650 = dst;
    sVar4 = HIST_count_wksp(local_438,&local_654,src,srcSize,pvVar1,sVar8);
    if (0xffffffffffffff88 < sVar4) {
      return sVar4;
    }
    if (sVar4 == srcSize) {
      return 1;
    }
    local_648 = srcSize >> 7;
    if (local_648 <= sVar4 && sVar4 != 1) {
      uVar6 = (uint)srcSize;
      uVar7 = 0x1f;
      if (uVar6 - 1 != 0) {
        for (; uVar6 - 1 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar3 = (uVar7 ^ 0xffffffe0) + 0x1e;
      uVar7 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar6 = (uVar7 ^ 0xffffffe0) + 0x21;
      uVar7 = 0x1f;
      if (local_654 != 0) {
        for (; local_654 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = (uVar7 ^ 0xffffffe0) + 0x22;
      if (uVar6 < uVar7) {
        uVar7 = uVar6;
      }
      if (uVar10 <= uVar3) {
        uVar3 = uVar10;
      }
      if (uVar3 < uVar7) {
        uVar3 = uVar7;
      }
      uVar10 = 5;
      if (5 < uVar3) {
        uVar10 = uVar3;
      }
      uVar7 = 0xc;
      if (uVar10 < 0xc) {
        uVar7 = uVar10;
      }
      local_640 = pvVar1;
      sVar4 = FSE_normalizeCount(local_638,uVar7,local_438,srcSize,local_654,(uint)(0x7ff < srcSize)
                                );
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
      sVar4 = FSE_writeNCount(local_650,dstSize,local_638,local_654,uVar7);
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
      sVar8 = FSE_buildCTable_wksp
                        ((FSE_CTable *)workSpace,local_638,local_654,uVar7,local_640,sVar8);
      if (0xffffffffffffff88 < sVar8) {
        return sVar8;
      }
      pvVar1 = (void *)((long)local_650 + sVar4);
      sVar8 = FSE_compress_usingCTable_generic
                        (pvVar1,dstSize - sVar4,src,srcSize,(FSE_CTable *)workSpace,
                         (uint)(local_648 + srcSize + 0xc <= dstSize - sVar4));
      if (0xffffffffffffff88 < sVar8) {
        return sVar8;
      }
      if (sVar8 != 0) {
        uVar9 = (long)pvVar1 + (sVar8 - (long)local_650);
        if (srcSize - 1 <= uVar9) {
          return 0;
        }
        return uVar9;
      }
    }
  }
  return 0;
}

Assistant:

size_t FSE_compress_wksp (void* dst, size_t dstSize, const void* src, size_t srcSize, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    unsigned count[FSE_MAX_SYMBOL_VALUE+1];
    S16   norm[FSE_MAX_SYMBOL_VALUE+1];
    FSE_CTable* CTable = (FSE_CTable*)workSpace;
    size_t const CTableSize = FSE_CTABLE_SIZE_U32(tableLog, maxSymbolValue);
    void* scratchBuffer = (void*)(CTable + CTableSize);
    size_t const scratchBufferSize = wkspSize - (CTableSize * sizeof(FSE_CTable));

    /* init conditions */
    if (wkspSize < FSE_COMPRESS_WKSP_SIZE_U32(tableLog, maxSymbolValue)) return ERROR(tableLog_tooLarge);
    if (srcSize <= 1) return 0;  /* Not compressible */
    if (!maxSymbolValue) maxSymbolValue = FSE_MAX_SYMBOL_VALUE;
    if (!tableLog) tableLog = FSE_DEFAULT_TABLELOG;

    /* Scan input and build symbol stats */
    {   CHECK_V_F(maxCount, HIST_count_wksp(count, &maxSymbolValue, src, srcSize, scratchBuffer, scratchBufferSize) );
        if (maxCount == srcSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;         /* each symbol present maximum once => not compressible */
        if (maxCount < (srcSize >> 7)) return 0;   /* Heuristic : not compressible enough */
    }

    tableLog = FSE_optimalTableLog(tableLog, srcSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(norm, tableLog, count, srcSize, maxSymbolValue, /* useLowProbCount */ srcSize >= 2048) );

    /* Write table description header */
    {   CHECK_V_F(nc_err, FSE_writeNCount(op, oend-op, norm, maxSymbolValue, tableLog) );
        op += nc_err;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(CTable, norm, maxSymbolValue, tableLog, scratchBuffer, scratchBufferSize) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, oend - op, src, srcSize, CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    /* check compressibility */
    if ( (size_t)(op-ostart) >= srcSize-1 ) return 0;

    return op-ostart;
}